

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded.cpp
# Opt level: O0

bool __thiscall clickhouse::CodedInputStream::Skip(CodedInputStream *this,size_t count)

{
  size_t sVar1;
  long in_RSI;
  ZeroCopyInput *in_RDI;
  size_t len;
  void *ptr;
  void **in_stack_ffffffffffffffc8;
  long local_18;
  
  local_18 = in_RSI;
  while( true ) {
    if (local_18 == 0) {
      return true;
    }
    sVar1 = ZeroCopyInput::Next(in_RDI,in_stack_ffffffffffffffc8,0x1e4b17);
    if (sVar1 == 0) break;
    local_18 = local_18 - sVar1;
  }
  return false;
}

Assistant:

bool CodedInputStream::Skip(size_t count) {
    while (count > 0) {
        const void* ptr;
        size_t len = input_->Next(&ptr, count);

        if (len == 0) {
            return false;
        }

        count -= len;
    }

    return true;
}